

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall AppParametersTest_precedent_Test::TestBody(AppParametersTest_precedent_Test *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  wchar_t **ppwVar4;
  wchar_t **ppwVar5;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *lhs;
  char *pcVar6;
  AssertHelper local_3a0 [8];
  Message local_398 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_390;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_380;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_370;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_4;
  Message local_348 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_340;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_330;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_320;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_3;
  Message local_2f8 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2f0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2e0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2d0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_2;
  Message local_2a8 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2a0;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_290;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_280;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_240 [8];
  Message local_238 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_230;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  Message local_200 [8];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  app_parameters local_1b0 [8];
  app_parameters parameters;
  undefined1 local_50 [8];
  ArgWrapper<wchar_t> envs;
  ArgWrapper<wchar_t> args;
  AppParametersTest_precedent_Test *this_local;
  
  ArgWrapper<wchar_t>::
  ArgWrapper<wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*>
            ((ArgWrapper<wchar_t> *)&envs.m_argv,L"/path/to/exe",L"some",L"words",L"--switch",
             L"-key",L"value",L"--",L"-other_key",L"value");
  ArgWrapper<wchar_t>::ArgWrapper<wchar_t_const*,wchar_t_const*>
            ((ArgWrapper<wchar_t> *)local_50,L"key=other_value",L"other_key=some_value");
  iVar3 = ArgWrapper<wchar_t>::argc((ArgWrapper<wchar_t> *)&envs.m_argv);
  ppwVar4 = ArgWrapper<wchar_t>::argv((ArgWrapper<wchar_t> *)&envs.m_argv);
  ppwVar5 = ArgWrapper<wchar_t>::argv((ArgWrapper<wchar_t> *)local_50);
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_1b0,iVar3,ppwVar4,ppwVar5,(unordered_set *)&gtest_ar.message_);
  std::
  unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  ::~unordered_set((unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
                    *)&gtest_ar.message_);
  lhs = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
        jessilib::app_parameters::precedent_abi_cxx11_();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[11],_nullptr>
            ((EqHelper *)local_1f8,"parameters.precedent()","u8\"some words\"",lhs,
             (char8_t (*) [11])"some words");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_200);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x160,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
            (&local_230,"switch");
  bVar2 = jessilib::app_parameters::has_switch(local_1b0,local_230._M_len,local_230._M_str);
  local_219 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_218,
               "parameters.has_switch(u8\"switch\")","false");
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x161,pcVar6);
    testing::internal::AssertHelper::operator=(local_240,local_238);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_290,"key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_2a0);
  local_280 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_arg_value
                        (local_1b0,local_290._M_len,local_290._M_str,local_2a0._M_len,
                         local_2a0._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[6],_nullptr>
            ((EqHelper *)local_270,"parameters.get_arg_value(u8\"key\")","u8\"value\"",&local_280,
             (char8_t (*) [6])0x69297e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(local_2a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x162,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_2e0,"key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_2f0);
  local_2d0 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_env_value
                        (local_1b0,local_2e0._M_len,local_2e0._M_str,local_2f0._M_len,
                         local_2f0._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[12],_nullptr>
            ((EqHelper *)local_2c0,"parameters.get_env_value(u8\"key\")","u8\"other_value\"",
             &local_2d0,(char8_t (*) [12])"other_value");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(local_2f8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x163,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_330,"key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_340);
  local_320 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_value
                        (local_1b0,local_330._M_len,local_330._M_str,local_340._M_len,
                         local_340._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[6],_nullptr>
            ((EqHelper *)local_310,"parameters.get_value(u8\"key\")","u8\"value\"",&local_320,
             (char8_t (*) [6])0x69297e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(local_348);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x164,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
            (&local_380,"other_key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_390);
  local_370 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_value
                        (local_1b0,local_380._M_len,local_380._M_str,local_390._M_len,
                         local_390._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[11],_nullptr>
            ((EqHelper *)local_360,"parameters.get_value(u8\"other_key\")","u8\"some_value\"",
             &local_370,(char8_t (*) [11])"some_value");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(local_398);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x165,pcVar6);
    testing::internal::AssertHelper::operator=(local_3a0,local_398);
    testing::internal::AssertHelper::~AssertHelper(local_3a0);
    testing::Message::~Message(local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  jessilib::app_parameters::~app_parameters(local_1b0);
  ArgWrapper<wchar_t>::~ArgWrapper((ArgWrapper<wchar_t> *)local_50);
  ArgWrapper<wchar_t>::~ArgWrapper((ArgWrapper<wchar_t> *)&envs.m_argv);
  return;
}

Assistant:

TEST(AppParametersTest, precedent) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe", L"some", L"words", L"--switch", L"-key", L"value", L"--", L"-other_key", L"value" };
	ArgWrapper<wchar_t> envs{ L"key=other_value", L"other_key=some_value" };
	app_parameters parameters{ args.argc(), args.argv(), envs.argv() };

	EXPECT_EQ(parameters.precedent(), u8"some words");
	EXPECT_TRUE(parameters.has_switch(u8"switch"));
	EXPECT_EQ(parameters.get_arg_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_env_value(u8"key"), u8"other_value");
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_value(u8"other_key"), u8"some_value");
}